

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

void __thiscall libchars::commands::lexer(commands *this)

{
  token *ptVar1;
  string local_30;
  commands *local_10;
  commands *this_local;
  
  ptVar1 = this->t_cmd;
  local_10 = this;
  if (ptVar1 != (token *)0x0) {
    token::~token(ptVar1);
    operator_delete(ptVar1,0x90);
  }
  this->t_par = (token *)0x0;
  value_abi_cxx11_(&local_30,this);
  ptVar1 = libchars::lexer(&local_30);
  this->t_cmd = ptVar1;
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void commands::lexer()
    {
        delete t_cmd;
        t_par = NULL;
        t_cmd = libchars::lexer(value());
    }